

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O1

void __thiscall QOpenGLTextureBlitter::release(QOpenGLTextureBlitter *this)

{
  GLenum GVar1;
  QOpenGLTextureBlitterPrivate *pQVar2;
  QOpenGLShaderProgram *this_00;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d_ptr).d;
  GVar1 = pQVar2->currentTarget;
  if (GVar1 == 0xde1) {
    iVar4 = 0;
  }
  else if (GVar1 == 0x84f5) {
    iVar4 = 2;
  }
  else if (GVar1 == 0x8d65) {
    iVar4 = 1;
  }
  else {
    local_40[0] = '\x02';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[10] = '\0';
    local_40[0xb] = '\0';
    local_40[0xc] = '\0';
    local_40[0xd] = '\0';
    local_40[0xe] = '\0';
    local_40[0xf] = '\0';
    local_40[0x10] = '\0';
    local_40[0x11] = '\0';
    local_40[0x12] = '\0';
    local_40[0x13] = '\0';
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    local_28 = "default";
    iVar4 = 0;
    QMessageLogger::warning(local_40,"Unsupported texture target 0x%x");
  }
  this_00 = *(QOpenGLShaderProgram **)
             ((long)&pQVar2->programs[0].glProgram.d + (ulong)(uint)(iVar4 * 0x30));
  if (this_00 != (QOpenGLShaderProgram *)0x0) {
    QOpenGLShaderProgram::release(this_00);
  }
  bVar3 = QOpenGLVertexArrayObject::isCreated((pQVar2->vao).d);
  if (bVar3) {
    QOpenGLVertexArrayObject::release((pQVar2->vao).d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureBlitter::release()
{
    Q_D(QOpenGLTextureBlitter);
    QOpenGLTextureBlitterPrivate::Program *p = &d->programs[targetToProgramIndex(d->currentTarget)];
    if (p->glProgram)
        p->glProgram->release();
    if (d->vao->isCreated())
        d->vao->release();
}